

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O2

void glob_audio_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  bool bVar1;
  int iVar2;
  uint which;
  long lVar3;
  t_float tVar4;
  int aiStack_c0 [5];
  t_audiosettings local_ac;
  float local_48;
  t_float local_38;
  t_float local_28;
  
  local_ac.a_api = audio_nextsettings.a_api;
  aiStack_c0[0] = 0x16a8cd;
  aiStack_c0[1] = 0;
  local_28 = atom_getfloatarg(0x10,argc,argv);
  aiStack_c0[0] = 0x16a8e2;
  aiStack_c0[1] = 0;
  local_38 = atom_getfloatarg(0x11,argc,argv);
  aiStack_c0[0] = 0x16a8f7;
  aiStack_c0[1] = 0;
  local_48 = atom_getfloatarg(0x12,argc,argv);
  aiStack_c0[0] = 0x16a909;
  aiStack_c0[1] = 0;
  tVar4 = atom_getfloatarg(0x13,argc,argv);
  local_ac.a_srate = (int)local_28;
  local_ac.a_advance = (int)local_38;
  local_ac.a_callback = (int)local_48;
  local_ac.a_blocksize = (int)tVar4;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    which = (uint)lVar3;
    aiStack_c0[0] = 0x16a943;
    aiStack_c0[1] = 0;
    tVar4 = atom_getfloatarg(which,argc,argv);
    local_ac.a_indevvec[lVar3] = (int)tVar4;
    aiStack_c0[0] = 0x16a95c;
    aiStack_c0[1] = 0;
    tVar4 = atom_getfloatarg(which | 4,argc,argv);
    local_ac.a_chindevvec[lVar3] = (int)tVar4;
    aiStack_c0[0] = 0x16a975;
    aiStack_c0[1] = 0;
    tVar4 = atom_getfloatarg(which | 8,argc,argv);
    local_ac.a_outdevvec[lVar3] = (int)tVar4;
    aiStack_c0[0] = 0x16a98e;
    aiStack_c0[1] = 0;
    tVar4 = atom_getfloatarg(which | 0xc,argc,argv);
    local_ac.a_choutdevvec[lVar3] = (int)tVar4;
  }
  local_ac.a_nindev = 0;
  iVar2 = 0;
  for (lVar3 = 7; lVar3 != 0xb; lVar3 = lVar3 + 1) {
    if (local_ac.a_indevvec[lVar3 + -2] != 0) {
      local_ac.a_indevvec[iVar2] = aiStack_c0[lVar3];
      local_ac.a_chindevvec[local_ac.a_nindev] = local_ac.a_indevvec[lVar3 + -2];
      iVar2 = local_ac.a_nindev + 1;
      local_ac.a_nindev = iVar2;
    }
  }
  local_ac.a_noutdev = 0;
  local_ac.a_nchoutdev = 0;
  for (lVar3 = 0x11; lVar3 != 0x15; lVar3 = lVar3 + 1) {
    if (local_ac.a_indevvec[lVar3 + -2] != 0) {
      local_ac.a_outdevvec[local_ac.a_nchoutdev] = aiStack_c0[lVar3];
      local_ac.a_choutdevvec[local_ac.a_noutdev] = local_ac.a_indevvec[lVar3 + -2];
      local_ac.a_nchoutdev = local_ac.a_noutdev + 1;
      local_ac.a_noutdev = local_ac.a_nchoutdev;
    }
  }
  local_ac.a_nchindev = local_ac.a_nindev;
  iVar2 = 0;
  if (0 < local_ac.a_callback) {
    iVar2 = local_ac.a_callback;
  }
  bVar1 = local_ac.a_callback < 1;
  aiStack_c0[0] = 0x16aa3e;
  aiStack_c0[1] = 0;
  local_ac.a_callback = iVar2;
  iVar2 = ilog2(local_ac.a_blocksize);
  iVar2 = 1 << ((byte)iVar2 & 0x1f);
  local_ac.a_blocksize = 0x40;
  if (0xfffff83e < iVar2 - 0x801U) {
    local_ac.a_blocksize = iVar2;
  }
  if (audio_callback_is_open == 0 && bVar1) {
    aiStack_c0[0] = 0x16aa6d;
    aiStack_c0[1] = 0;
    sys_close_audio();
  }
  aiStack_c0[0] = 0x16aa7a;
  aiStack_c0[1] = 0;
  sys_set_audio_settings(&local_ac);
  if (local_ac.a_callback != 0 || audio_callback_is_open != 0) {
    sched_reopenmeplease();
    return;
  }
  sys_reopen_audio();
  return;
}

Assistant:

void glob_audio_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_audiosettings as;
    as.a_api = audio_nextsettings.a_api;
    as.a_srate = atom_getfloatarg(16, argc, argv);
    as.a_advance = atom_getfloatarg(17, argc, argv);
    as.a_callback = atom_getfloatarg(18, argc, argv);
    as.a_blocksize = atom_getfloatarg(19, argc, argv);

    for (i = 0; i < 4; i++)
    {
        as.a_indevvec[i] = atom_getfloatarg(i, argc, argv);
        as.a_chindevvec[i] = atom_getfloatarg(i+4, argc, argv);
        as.a_outdevvec[i] = atom_getfloatarg(i+8, argc, argv);
        as.a_choutdevvec[i] = atom_getfloatarg(i+12, argc, argv);
    }
        /* compact out any zeros and count nonzero entries */
    for (i = 0, as.a_nindev = 0; i < 4; i++)
    {
        if (as.a_chindevvec[i])
        {
            as.a_indevvec[as.a_nindev] = as.a_indevvec[i];
            as.a_chindevvec[as.a_nindev] = as.a_chindevvec[i];
            as.a_nindev++;
        }
    }
    for (i = 0, as.a_noutdev = 0; i < 4; i++)
    {
        if (as.a_choutdevvec[i])
        {
            as.a_outdevvec[as.a_noutdev] = as.a_outdevvec[i];
            as.a_choutdevvec[as.a_noutdev] = as.a_choutdevvec[i];
            as.a_noutdev++;
        }
    }
    as.a_nchindev = as.a_nindev;
    as.a_nchoutdev = as.a_noutdev;
    if (as.a_callback < 0)
        as.a_callback = 0;
    as.a_blocksize = (1<<ilog2(as.a_blocksize));
    if (as.a_blocksize < DEFDACBLKSIZE || as.a_blocksize > MAXBLOCKSIZE)
            as.a_blocksize = DEFDACBLKSIZE;

    if (!audio_callback_is_open && !as.a_callback)
        sys_close_audio();
    sys_set_audio_settings(&as);
    if (!audio_callback_is_open && !as.a_callback)
        sys_reopen_audio();
    else sched_reopenmeplease();
}